

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectDumper.cpp
# Opt level: O0

void RecyclerObjectDumper::DumpObject(type_info *typeinfo,bool isArray,void *objectAddress)

{
  bool bVar1;
  char16_t *form;
  char *pcVar2;
  _func_bool_type_info_ptr_bool_void_ptr *local_28;
  DumpFunction dumpFunction;
  void *objectAddress_local;
  type_info *ptStack_10;
  bool isArray_local;
  type_info *typeinfo_local;
  
  dumpFunction = (DumpFunction)objectAddress;
  objectAddress_local._7_1_ = isArray;
  ptStack_10 = typeinfo;
  if (typeinfo == (type_info *)0x0) {
    Output::Print(L"Address %p",objectAddress);
  }
  else if (((dumpFunctionMap == (DumpFunctionMap *)0x0) ||
           (bVar1 = JsUtil::
                    BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::TryGetValue<std::type_info_const*>
                              ((BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)dumpFunctionMap,&stack0xfffffffffffffff0,&local_28), !bVar1)) ||
          (bVar1 = (*local_28)(ptStack_10,(bool)(objectAddress_local._7_1_ & 1),dumpFunction),
          !bVar1)) {
    form = L"%S %p";
    if ((objectAddress_local._7_1_ & 1) != 0) {
      form = L"%S[] %p";
    }
    pcVar2 = std::type_info::name(ptStack_10);
    Output::Print(form,pcVar2,dumpFunction);
  }
  return;
}

Assistant:

void
RecyclerObjectDumper::DumpObject(type_info const * typeinfo, bool isArray, void * objectAddress)
{
    if (typeinfo == nullptr)
    {
        Output::Print(_u("Address %p"), objectAddress);
    }
    else
    {
        DumpFunction dumpFunction;
        if (dumpFunctionMap == nullptr || !dumpFunctionMap->TryGetValue(typeinfo, &dumpFunction) || !dumpFunction(typeinfo, isArray, objectAddress))
        {
            Output::Print(isArray? _u("%S[] %p") : _u("%S %p"), typeinfo->name(), objectAddress);
        }
    }
}